

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

Module * mocker::allocateRegisters(Module *__return_storage_ptr__,Module *module)

{
  mapped_type *section;
  char *pcVar1;
  pointer p_Var2;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *plVar3;
  pointer p_Var4;
  vector<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  funcBegs;
  _Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  local_458;
  RegisterAllocator local_438;
  
  nasm::Module::Module(__return_storage_ptr__,module);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,".text",(allocator<char> *)&local_458);
  section = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&__return_storage_ptr__->sections,(key_type *)&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  local_458._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar3 = &section->lines;
  local_438.section = (Section *)plVar3;
  while (local_438.section =
              (Section *)
              (((_List_impl *)&((local_438.section)->name)._M_dataplus)->_M_node).
              super__List_node_base._M_next, local_438.section != (Section *)plVar3) {
    if ((((local_438.section)->lines).
         super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl._M_node.
         _M_size == 0) &&
       (pcVar1 = (char *)std::__cxx11::string::at((ulong)&((local_438.section)->name).field_2),
       *pcVar1 != '.')) {
      std::
      vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
      ::emplace_back<std::_List_iterator<mocker::nasm::Line>&>
                ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
                  *)&local_458,(_List_iterator<mocker::nasm::Line> *)&local_438);
    }
  }
  local_438.section = (Section *)plVar3;
  std::
  vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
  ::emplace_back<std::_List_iterator<mocker::nasm::Line>>
            ((vector<std::_List_const_iterator<mocker::nasm::Line>,std::allocator<std::_List_const_iterator<mocker::nasm::Line>>>
              *)&local_458,(_List_iterator<mocker::nasm::Line> *)&local_438);
  p_Var4 = local_458._M_impl.super__Vector_impl_data._M_finish + -1;
  for (p_Var2 = local_458._M_impl.super__Vector_impl_data._M_start; p_Var2 != p_Var4;
      p_Var2 = p_Var2 + 1) {
    detail::RegisterAllocator::RegisterAllocator
              (&local_438,section,p_Var2->_M_node,p_Var2[1]._M_node);
    detail::RegisterAllocator::allocate(&local_438);
    detail::RegisterAllocator::~RegisterAllocator(&local_438);
  }
  std::
  _Vector_base<std::_List_const_iterator<mocker::nasm::Line>,_std::allocator<std::_List_const_iterator<mocker::nasm::Line>_>_>
  ::~_Vector_base(&local_458);
  return __return_storage_ptr__;
}

Assistant:

nasm::Module allocateRegisters(const nasm::Module &module) {
  auto res = module;
  auto &text = res.getSection(".text");
  std::vector<LineIter> funcBegs;
  for (auto iter = text.getLines().begin(); iter != text.getLines().end();
       ++iter) {
    if (!iter->inst && iter->label.at(0) != '.')
      funcBegs.emplace_back(iter);
  }

  funcBegs.emplace_back(text.getLines().end());
  for (auto iter = funcBegs.begin(), ed = std::prev(funcBegs.end()); iter != ed;
       ++iter) {
    detail::RegisterAllocator(text, *iter, *(iter + 1)).allocate();
  }
  return res;
}